

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O3

void printKVDataJSON(ktx_uint8_t *pKvd,ktx_uint32_t kvdLen,ktx_uint32_t base_indent,
                    ktx_uint32_t indent_width,_Bool minified)

{
  byte *pbVar1;
  uint uVar2;
  _Bool _Var3;
  ktx_error_code_e kVar4;
  uint uVar5;
  int iVar6;
  ktxHashList This;
  ulong uVar7;
  uint8_t *puVar8;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  undefined7 in_register_00000081;
  char *pcVar12;
  uint8_t *puVar13;
  bool bVar14;
  ktx_uint32_t valueLen;
  char *key;
  char *value;
  ktxHashList kvDataHead;
  ktx_uint32_t keyLen;
  uint local_7c;
  uint8_t *local_78;
  char *local_70;
  uint *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong local_50;
  uint8_t *local_48;
  ktxHashList local_40;
  uint local_34;
  
  puVar13 = " ";
  bVar14 = (int)CONCAT71(in_register_00000081,minified) != 0;
  if (bVar14) {
    puVar13 = "";
  }
  local_78 = "\n";
  if (bVar14) {
    local_78 = "";
  }
  local_40 = (ktxHashListEntry *)0x0;
  if ((pKvd == (ktx_uint8_t *)0x0) || (kvdLen == 0)) {
    __assert_fail("pKvd != NULL && kvdLen > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                  ,0xf2,
                  "void printKVDataJSON(ktx_uint8_t *, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, _Bool)"
                 );
  }
  kVar4 = ktxHashList_Deserialize(&local_40,kvdLen,pKvd);
  if (local_40 != (ktxHashListEntry *)0x0 && kVar4 == KTX_SUCCESS) {
    uVar5 = indent_width * base_indent;
    local_54 = (base_indent + 1) * indent_width;
    bVar14 = true;
    uVar7 = 0;
    This = local_40;
    local_48 = puVar13;
    do {
      ktxHashListEntry_GetKey(This,&local_34,&local_70);
      ktxHashListEntry_GetValue(This,&local_7c,&local_68);
      puVar9 = local_68;
      pcVar12 = local_70;
      if (local_68 == (uint *)0x0) {
        _Var3 = isKnownKeyValue(local_70);
        if (!_Var3) {
          if (!bVar14) {
            fprintf(_stdout,",%s",local_78);
            pcVar12 = local_70;
          }
          bVar14 = false;
          printf("%*s\"%s\":%snull",(ulong)uVar5,"",pcVar12,puVar13);
        }
      }
      else {
        iVar6 = strcmp(local_70,"KTXglFormat");
        if (iVar6 == 0) {
          if (local_7c == 0xc) {
            if (!bVar14) {
              fprintf(_stdout,",%s",local_78);
              puVar9 = local_68;
              pcVar12 = local_70;
            }
            puVar13 = local_48;
            puVar8 = local_78;
            local_5c = *puVar9;
            local_58 = puVar9[1];
            local_50 = CONCAT44(local_50._4_4_,puVar9[2]);
            printf("%*s\"%s\":%s{%s",(ulong)uVar5,"",pcVar12,local_48,local_78);
            uVar11 = local_54;
            printf("%*s\"glInternalformat\":%s%u,%s",(ulong)local_54,"",puVar13,(ulong)local_5c,
                   puVar8);
            printf("%*s\"glFormat\":%s%u,%s",(ulong)uVar11,"",puVar13,(ulong)local_58,puVar8);
            pcVar12 = "%*s\"glType\":%s%u%s";
LAB_001ce663:
            printf(pcVar12,(ulong)uVar11,"",puVar13,local_50 & 0xffffffff,puVar8);
LAB_001ce67a:
            bVar14 = false;
            printf("%*s}",(ulong)uVar5,"");
          }
        }
        else {
          iVar6 = strcmp(pcVar12,"KTXanimData");
          if (iVar6 == 0) {
            if (local_7c == 0xc) {
              if (!bVar14) {
                fprintf(_stdout,",%s",local_78);
                puVar9 = local_68;
                pcVar12 = local_70;
              }
              puVar13 = local_48;
              puVar8 = local_78;
              local_5c = *puVar9;
              local_58 = puVar9[1];
              local_50 = CONCAT44(local_50._4_4_,puVar9[2]);
              printf("%*s\"%s\":%s{%s",(ulong)uVar5,"",pcVar12,local_48,local_78);
              uVar11 = local_54;
              printf("%*s\"duration\":%s%u,%s",(ulong)local_54,"",puVar13,(ulong)local_5c,puVar8);
              printf("%*s\"timescale\":%s%u,%s",(ulong)uVar11,"",puVar13,(ulong)local_58,puVar8);
              pcVar12 = "%*s\"loopCount\":%s%u%s";
              goto LAB_001ce663;
            }
          }
          else {
            iVar6 = strcmp(pcVar12,"KTXcubemapIncomplete");
            if (iVar6 == 0) {
              if (local_7c == 1) {
                if (!bVar14) {
                  fprintf(_stdout,",%s",local_78);
                  puVar9 = local_68;
                  pcVar12 = local_70;
                }
                puVar8 = local_78;
                uVar11 = *puVar9;
                printf("%*s\"%s\":%s{%s",(ulong)uVar5,"",pcVar12,puVar13,local_78);
                uVar2 = local_54;
                pcVar12 = "true";
                if ((uVar11 & 1) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"positiveX\":%s%s,%s",(ulong)local_54,"",puVar13,pcVar12,puVar8);
                pcVar12 = "true";
                if ((uVar11 & 2) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"negativeX\":%s%s,%s",(ulong)uVar2,"",puVar13,pcVar12,puVar8);
                pcVar12 = "true";
                if ((uVar11 & 4) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"positiveY\":%s%s,%s",(ulong)uVar2,"",puVar13,pcVar12,puVar8);
                pcVar12 = "true";
                if ((uVar11 & 8) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"negativeY\":%s%s,%s",(ulong)uVar2,"",puVar13,pcVar12,puVar8);
                pcVar12 = "true";
                if ((uVar11 & 0x10) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"positiveZ\":%s%s,%s",(ulong)uVar2,"",puVar13,pcVar12,puVar8);
                pcVar12 = "true";
                if ((uVar11 & 0x20) == 0) {
                  pcVar12 = "false";
                }
                printf("%*s\"negativeZ\":%s%s%s",(ulong)uVar2,"",puVar13,pcVar12,puVar8);
                goto LAB_001ce67a;
              }
            }
            else {
              _Var3 = isKnownKeyValueUINT32(pcVar12);
              if (_Var3) {
                if (local_7c == 4) {
                  if (!bVar14) {
                    fprintf(_stdout,",%s",local_78);
                    puVar9 = local_68;
                    pcVar12 = local_70;
                  }
                  bVar14 = false;
                  printf("%*s\"%s\":%s%u",(ulong)uVar5,"",pcVar12,puVar13,(ulong)*puVar9);
                }
              }
              else {
                _Var3 = isKnownKeyValueString(pcVar12);
                if (_Var3) {
                  if (*(byte *)((long)puVar9 + (ulong)(local_7c - 1)) == 0) {
                    if (!bVar14) {
                      fprintf(_stdout,",%s",local_78);
                      puVar9 = local_68;
                      pcVar12 = local_70;
                    }
                    bVar14 = false;
                    printf("%*s\"%s\":%s\"%s\"",(ulong)uVar5,"",pcVar12,puVar13,puVar9);
                  }
                }
                else {
                  local_50 = uVar7;
                  if (!bVar14) {
                    fprintf(_stdout,",%s",local_78);
                    pcVar12 = local_70;
                  }
                  printf("%*s\"%s\":%s[",(ulong)uVar5,"",pcVar12,puVar13);
                  uVar7 = (ulong)local_7c;
                  if (local_7c != 0) {
                    uVar10 = 0;
                    do {
                      pbVar1 = (byte *)((long)local_68 + uVar10);
                      uVar10 = uVar10 + 1;
                      puVar13 = (uint8_t *)", ";
                      if (uVar10 == uVar7) {
                        puVar13 = "";
                      }
                      fprintf(_stdout,"%d%s",(ulong)(uint)(int)(char)*pbVar1,puVar13);
                      uVar7 = (ulong)local_7c;
                    } while (uVar10 < uVar7);
                  }
                  fputc(0x5d,_stdout);
                  bVar14 = false;
                  uVar7 = local_50;
                  puVar13 = local_48;
                }
              }
            }
          }
        }
      }
      This = ktxHashList_Next(This);
    } while ((This != (ktxHashListEntry *)0x0) &&
            (uVar11 = (uint)uVar7, uVar7 = (ulong)(uVar11 + 1), uVar11 < 99));
    fputs((char *)local_78,_stdout);
    ktxHashList_Destruct(&local_40);
  }
  return;
}

Assistant:

void
printKVDataJSON(ktx_uint8_t* pKvd, ktx_uint32_t kvdLen, ktx_uint32_t base_indent, ktx_uint32_t indent_width, bool minified)
{
    const char* space = minified ? "" : " ";
    const char* nl = minified ? "" : "\n";

    KTX_error_code result;
    ktxHashList kvDataHead = 0;

    assert(pKvd != NULL && kvdLen > 0);

    result = ktxHashList_Deserialize(&kvDataHead, kvdLen, pKvd);
    if (result != KTX_SUCCESS) {
        // Logging while printing JSON is not possible, we rely on the validation step to provide meaningful errors
        // fprintf(stdout, "Failed to parse or not enough memory to build list of key/value pairs.\n");
        return;
    }

    if (kvDataHead == NULL)
        return;

    int entryIndex = 0;
    ktxHashListEntry* entry = kvDataHead;
    bool firstPrint = true; // Marks if the first print did not occur yet (first print != first entry)
    for (; entry != NULL && entryIndex < MAX_NUM_KVD_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
        char* key;
        char* value;
        ktx_uint32_t keyLen, valueLen;

        ktxHashListEntry_GetKey(entry, &keyLen, &key);
        ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
        // Keys must be NUL terminated.
        if (!value) {
            if (!isKnownKeyValue(key)) {
                // Known keys are not be printed with null
                if (!firstPrint)
                    fprintf(stdout, ",%s", nl);
                firstPrint = false;
                PRINT_INDENT(0, "\"%s\":%snull", key, space)
            }
        } else {
            if (strcmp(key, "KTXglFormat") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t glInternalformat = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t glFormat = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t glType = *(const ktx_uint32_t*) (value + 8);
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"glInternalformat\":%s%u,%s", space, glInternalformat, nl)
                    PRINT_INDENT(1, "\"glFormat\":%s%u,%s", space, glFormat, nl)
                    PRINT_INDENT(1, "\"glType\":%s%u%s", space, glType, nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (strcmp(key, "KTXanimData") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t duration = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t timescale = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t loopCount = *(const ktx_uint32_t*) (value + 8);
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"duration\":%s%u,%s", space, duration, nl)
                    PRINT_INDENT(1, "\"timescale\":%s%u,%s", space, timescale, nl)
                    PRINT_INDENT(1, "\"loopCount\":%s%u%s", space, loopCount, nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (strcmp(key, "KTXcubemapIncomplete") == 0) {
                if (valueLen == sizeof(ktx_uint8_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint8_t faces = *value;
                    PRINT_INDENT(0, "\"%s\":%s{%s", key, space, nl)
                    PRINT_INDENT(1, "\"positiveX\":%s%s,%s", space, faces & 1u << 0u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeX\":%s%s,%s", space, faces & 1u << 1u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"positiveY\":%s%s,%s", space, faces & 1u << 2u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeY\":%s%s,%s", space, faces & 1u << 3u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"positiveZ\":%s%s,%s", space, faces & 1u << 4u ? "true" : "false", nl)
                    PRINT_INDENT(1, "\"negativeZ\":%s%s%s", space, faces & 1u << 5u ? "true" : "false", nl)
                    PRINT_INDENT_NOARG(0, "}")
                }
            } else if (isKnownKeyValueUINT32(key)) {
                if (valueLen == sizeof(ktx_uint32_t)) {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    ktx_uint32_t number = *(const ktx_uint32_t*) value;
                    PRINT_INDENT(0, "\"%s\":%s%u", key, space, number)
                }
            } else if (isKnownKeyValueString(key)) {
                if (value[valueLen-1] == '\0') {
                    if (!firstPrint)
                        fprintf(stdout, ",%s", nl);
                    firstPrint = false;
                    PRINT_INDENT(0, "\"%s\":%s\"%s\"", key, space, value)
                }
            } else {
                if (!firstPrint)
                    fprintf(stdout, ",%s", nl);
                firstPrint = false;
                PRINT_INDENT(0, "\"%s\":%s[", key, space)
                for (ktx_uint32_t i = 0; i < valueLen; i++)
                    fprintf(stdout, "%d%s", (int) value[i], i + 1 == valueLen ? "" : ", ");
                fprintf(stdout, "]");
            }
        }
    }
    fprintf(stdout, "%s", nl);

    ktxHashList_Destruct(&kvDataHead);
}